

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

int BuildMapBitdepth16To8(TIFFRGBAImage *img)

{
  uint8_t *puVar1;
  char cVar2;
  char cVar10;
  short sVar18;
  ushort uVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  undefined1 auVar33 [16];
  uint8_t *puVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  short sVar54;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  short sVar63;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined4 uVar55;
  undefined6 uVar56;
  undefined8 uVar57;
  undefined1 auVar58 [12];
  undefined1 auVar59 [14];
  undefined1 auVar62 [16];
  undefined4 uVar64;
  undefined6 uVar65;
  undefined8 uVar66;
  undefined1 auVar67 [12];
  undefined1 auVar68 [14];
  undefined1 auVar71 [16];
  
  if (img->Bitdepth16To8 == (uint8_t *)0x0) {
    puVar34 = (uint8_t *)_TIFFmallocExt(img->tif,0x10000);
    img->Bitdepth16To8 = puVar34;
    auVar33 = _DAT_0032fb70;
    if (puVar34 == (uint8_t *)0x0) {
      iVar36 = 0;
      TIFFErrorExtR(img->tif,"BuildMapBitdepth16To8","Out of memory");
    }
    else {
      iVar36 = 0xc;
      iVar37 = 0xd;
      iVar38 = 0xe;
      iVar39 = 0xf;
      iVar40 = 8;
      iVar41 = 9;
      iVar42 = 10;
      iVar43 = 0xb;
      iVar44 = 4;
      iVar45 = 5;
      iVar46 = 6;
      iVar47 = 7;
      iVar48 = 0;
      iVar49 = 1;
      iVar50 = 2;
      iVar51 = 3;
      lVar35 = 0;
      do {
        auVar60._0_4_ = iVar48 + 0x80;
        auVar60._4_4_ = iVar49 + 0x80;
        auVar60._8_4_ = iVar50 + 0x80;
        auVar60._12_4_ = iVar51 + 0x80;
        auVar72._0_4_ = iVar44 + 0x80;
        auVar72._4_4_ = iVar45 + 0x80;
        auVar72._8_4_ = iVar46 + 0x80;
        auVar72._12_4_ = iVar47 + 0x80;
        auVar69._0_4_ = iVar40 + 0x80;
        auVar69._4_4_ = iVar41 + 0x80;
        auVar69._8_4_ = iVar42 + 0x80;
        auVar69._12_4_ = iVar43 + 0x80;
        auVar52._0_4_ = iVar36 + 0x80;
        auVar52._4_4_ = iVar37 + 0x80;
        auVar52._8_4_ = iVar38 + 0x80;
        auVar52._12_4_ = iVar39 + 0x80;
        auVar53._0_4_ = auVar52._0_4_ / 0x101;
        auVar53._4_4_ = auVar52._4_4_ / 0x101;
        auVar53._8_4_ = (undefined4)((auVar52._8_8_ & 0xffffffff) / 0x101);
        auVar53._12_4_ = auVar52._12_4_ / 0x101;
        auVar70._0_4_ = auVar69._0_4_ / 0x101;
        auVar70._4_4_ = auVar69._4_4_ / 0x101;
        auVar70._8_4_ = (undefined4)((auVar69._8_8_ & 0xffffffff) / 0x101);
        auVar70._12_4_ = auVar69._12_4_ / 0x101;
        auVar73._0_4_ = auVar72._0_4_ / 0x101;
        auVar73._4_4_ = auVar72._4_4_ / 0x101;
        auVar73._8_4_ = (undefined4)((auVar72._8_8_ & 0xffffffff) / 0x101);
        auVar73._12_4_ = auVar72._12_4_ / 0x101;
        auVar61._0_4_ = auVar60._0_4_ / 0x101;
        auVar61._4_4_ = auVar60._4_4_ / 0x101;
        auVar61._8_4_ = (undefined4)((auVar60._8_8_ & 0xffffffff) / 0x101);
        auVar61._12_4_ = auVar60._12_4_ / 0x101;
        auVar61 = auVar61 & auVar33;
        auVar73 = auVar73 & auVar33;
        sVar18 = auVar61._0_2_;
        cVar2 = (0 < sVar18) * (sVar18 < 0x100) * auVar61[0] - (0xff < sVar18);
        uVar19 = auVar61._2_2_;
        sVar54 = CONCAT11((uVar19 != 0) * (uVar19 < 0x100) * auVar61[2] - (0xff < uVar19),cVar2);
        sVar18 = auVar61._4_2_;
        cVar3 = (0 < sVar18) * (sVar18 < 0x100) * auVar61[4] - (0xff < sVar18);
        uVar19 = auVar61._6_2_;
        uVar55 = CONCAT13((uVar19 != 0) * (uVar19 < 0x100) * auVar61[6] - (0xff < uVar19),
                          CONCAT12(cVar3,sVar54));
        sVar18 = auVar61._8_2_;
        cVar4 = (0 < sVar18) * (sVar18 < 0x100) * auVar61[8] - (0xff < sVar18);
        sVar18 = auVar61._10_2_;
        uVar56 = CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar61[10] - (0xff < sVar18),
                          CONCAT14(cVar4,uVar55));
        sVar18 = auVar61._12_2_;
        cVar5 = (0 < sVar18) * (sVar18 < 0x100) * auVar61[0xc] - (0xff < sVar18);
        sVar18 = auVar61._14_2_;
        uVar57 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar61[0xe] - (0xff < sVar18),
                          CONCAT16(cVar5,uVar56));
        sVar18 = auVar73._0_2_;
        cVar6 = (0 < sVar18) * (sVar18 < 0x100) * auVar73[0] - (0xff < sVar18);
        uVar19 = auVar73._2_2_;
        auVar58._0_10_ =
             CONCAT19((uVar19 != 0) * (uVar19 < 0x100) * auVar73[2] - (0xff < uVar19),
                      CONCAT18(cVar6,uVar57));
        sVar18 = auVar73._4_2_;
        cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar73[4] - (0xff < sVar18);
        auVar58[10] = cVar7;
        uVar19 = auVar73._6_2_;
        auVar58[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * auVar73[6] - (0xff < uVar19);
        sVar18 = auVar73._8_2_;
        cVar8 = (0 < sVar18) * (sVar18 < 0x100) * auVar73[8] - (0xff < sVar18);
        auVar59[0xc] = cVar8;
        auVar59._0_12_ = auVar58;
        sVar18 = auVar73._10_2_;
        auVar59[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar73[10] - (0xff < sVar18);
        sVar18 = auVar73._12_2_;
        cVar9 = (0 < sVar18) * (sVar18 < 0x100) * auVar73[0xc] - (0xff < sVar18);
        auVar62[0xe] = cVar9;
        auVar62._0_14_ = auVar59;
        sVar18 = auVar73._14_2_;
        auVar62[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar73[0xe] - (0xff < sVar18);
        auVar70 = auVar70 & auVar33;
        auVar53 = auVar53 & auVar33;
        sVar18 = auVar70._0_2_;
        cVar10 = (0 < sVar18) * (sVar18 < 0x100) * auVar70[0] - (0xff < sVar18);
        uVar19 = auVar70._2_2_;
        sVar63 = CONCAT11((uVar19 != 0) * (uVar19 < 0x100) * auVar70[2] - (0xff < uVar19),cVar10);
        sVar18 = auVar70._4_2_;
        cVar11 = (0 < sVar18) * (sVar18 < 0x100) * auVar70[4] - (0xff < sVar18);
        uVar19 = auVar70._6_2_;
        uVar64 = CONCAT13((uVar19 != 0) * (uVar19 < 0x100) * auVar70[6] - (0xff < uVar19),
                          CONCAT12(cVar11,sVar63));
        sVar18 = auVar70._8_2_;
        cVar12 = (0 < sVar18) * (sVar18 < 0x100) * auVar70[8] - (0xff < sVar18);
        sVar18 = auVar70._10_2_;
        uVar65 = CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar70[10] - (0xff < sVar18),
                          CONCAT14(cVar12,uVar64));
        sVar18 = auVar70._12_2_;
        cVar13 = (0 < sVar18) * (sVar18 < 0x100) * auVar70[0xc] - (0xff < sVar18);
        sVar18 = auVar70._14_2_;
        uVar66 = CONCAT17((0 < sVar18) * (sVar18 < 0x100) * auVar70[0xe] - (0xff < sVar18),
                          CONCAT16(cVar13,uVar65));
        sVar18 = auVar53._0_2_;
        cVar14 = (0 < sVar18) * (sVar18 < 0x100) * auVar53[0] - (0xff < sVar18);
        uVar19 = auVar53._2_2_;
        auVar67._0_10_ =
             CONCAT19((uVar19 != 0) * (uVar19 < 0x100) * auVar53[2] - (0xff < uVar19),
                      CONCAT18(cVar14,uVar66));
        sVar18 = auVar53._4_2_;
        cVar15 = (0 < sVar18) * (sVar18 < 0x100) * auVar53[4] - (0xff < sVar18);
        auVar67[10] = cVar15;
        uVar19 = auVar53._6_2_;
        auVar67[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * auVar53[6] - (0xff < uVar19);
        sVar18 = auVar53._8_2_;
        cVar16 = (0 < sVar18) * (sVar18 < 0x100) * auVar53[8] - (0xff < sVar18);
        auVar68[0xc] = cVar16;
        auVar68._0_12_ = auVar67;
        sVar18 = auVar53._10_2_;
        auVar68[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar53[10] - (0xff < sVar18);
        sVar18 = auVar53._12_2_;
        cVar17 = (0 < sVar18) * (sVar18 < 0x100) * auVar53[0xc] - (0xff < sVar18);
        auVar71[0xe] = cVar17;
        auVar71._0_14_ = auVar68;
        sVar18 = auVar53._14_2_;
        auVar71[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar53[0xe] - (0xff < sVar18);
        sVar18 = (short)((uint)uVar55 >> 0x10);
        sVar20 = (short)((uint6)uVar56 >> 0x20);
        sVar21 = (short)((ulong)uVar57 >> 0x30);
        sVar22 = (short)((unkuint10)auVar58._0_10_ >> 0x40);
        sVar23 = auVar58._10_2_;
        sVar24 = auVar59._12_2_;
        sVar25 = auVar62._14_2_;
        sVar26 = (short)((uint)uVar64 >> 0x10);
        sVar27 = (short)((uint6)uVar65 >> 0x20);
        sVar28 = (short)((ulong)uVar66 >> 0x30);
        sVar29 = (short)((unkuint10)auVar67._0_10_ >> 0x40);
        sVar30 = auVar67._10_2_;
        sVar31 = auVar68._12_2_;
        sVar32 = auVar71._14_2_;
        puVar1 = puVar34 + lVar35;
        *puVar1 = (0 < sVar54) * (sVar54 < 0x100) * cVar2 - (0xff < sVar54);
        puVar1[1] = (0 < sVar18) * (sVar18 < 0x100) * cVar3 - (0xff < sVar18);
        puVar1[2] = (0 < sVar20) * (sVar20 < 0x100) * cVar4 - (0xff < sVar20);
        puVar1[3] = (0 < sVar21) * (sVar21 < 0x100) * cVar5 - (0xff < sVar21);
        puVar1[4] = (0 < sVar22) * (sVar22 < 0x100) * cVar6 - (0xff < sVar22);
        puVar1[5] = (0 < sVar23) * (sVar23 < 0x100) * cVar7 - (0xff < sVar23);
        puVar1[6] = (0 < sVar24) * (sVar24 < 0x100) * cVar8 - (0xff < sVar24);
        puVar1[7] = (0 < sVar25) * (sVar25 < 0x100) * cVar9 - (0xff < sVar25);
        puVar1[8] = (0 < sVar63) * (sVar63 < 0x100) * cVar10 - (0xff < sVar63);
        puVar1[9] = (0 < sVar26) * (sVar26 < 0x100) * cVar11 - (0xff < sVar26);
        puVar1[10] = (0 < sVar27) * (sVar27 < 0x100) * cVar12 - (0xff < sVar27);
        puVar1[0xb] = (0 < sVar28) * (sVar28 < 0x100) * cVar13 - (0xff < sVar28);
        puVar1[0xc] = (0 < sVar29) * (sVar29 < 0x100) * cVar14 - (0xff < sVar29);
        puVar1[0xd] = (0 < sVar30) * (sVar30 < 0x100) * cVar15 - (0xff < sVar30);
        puVar1[0xe] = (0 < sVar31) * (sVar31 < 0x100) * cVar16 - (0xff < sVar31);
        puVar1[0xf] = (0 < sVar32) * (sVar32 < 0x100) * cVar17 - (0xff < sVar32);
        lVar35 = lVar35 + 0x10;
        iVar48 = iVar48 + 0x10;
        iVar49 = iVar49 + 0x10;
        iVar50 = iVar50 + 0x10;
        iVar51 = iVar51 + 0x10;
        iVar44 = iVar44 + 0x10;
        iVar45 = iVar45 + 0x10;
        iVar46 = iVar46 + 0x10;
        iVar47 = iVar47 + 0x10;
        iVar40 = iVar40 + 0x10;
        iVar41 = iVar41 + 0x10;
        iVar42 = iVar42 + 0x10;
        iVar43 = iVar43 + 0x10;
        iVar36 = iVar36 + 0x10;
        iVar37 = iVar37 + 0x10;
        iVar38 = iVar38 + 0x10;
        iVar39 = iVar39 + 0x10;
      } while (lVar35 != 0x10000);
      iVar36 = 1;
    }
    return iVar36;
  }
  __assert_fail("img->Bitdepth16To8 == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_getimage.c"
                ,0xc65,"int BuildMapBitdepth16To8(TIFFRGBAImage *)");
}

Assistant:

static int BuildMapBitdepth16To8(TIFFRGBAImage *img)
{
    static const char module[] = "BuildMapBitdepth16To8";
    uint8_t *m;
    uint32_t n;
    assert(img->Bitdepth16To8 == NULL);
    img->Bitdepth16To8 = _TIFFmallocExt(img->tif, 65536);
    if (img->Bitdepth16To8 == NULL)
    {
        TIFFErrorExtR(img->tif, module, "Out of memory");
        return (0);
    }
    m = img->Bitdepth16To8;
    for (n = 0; n < 65536; n++)
        *m++ = (uint8_t)((n + 128) / 257);
    return (1);
}